

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DockNodeMoveWindows(ImGuiDockNode *dst_node,ImGuiDockNode *src_node)

{
  int *piVar1;
  ImGuiTabBar *pIVar2;
  ImGuiWindow *window;
  ImGuiWindow **ppIVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  
  pIVar2 = src_node->TabBar;
  if (pIVar2 == (ImGuiTabBar *)0x0) {
    bVar6 = false;
  }
  else {
    bVar6 = dst_node->TabBar == (ImGuiTabBar *)0x0;
  }
  if (bVar6) {
    dst_node->TabBar = pIVar2;
    src_node->TabBar = (ImGuiTabBar *)0x0;
  }
  if (0 < (src_node->Windows).Size) {
    lVar4 = 8;
    lVar5 = 0;
    do {
      if (pIVar2 == (ImGuiTabBar *)0x0) {
        ppIVar3 = (src_node->Windows).Data + lVar5;
      }
      else {
        ppIVar3 = (ImGuiWindow **)((long)&((pIVar2->Tabs).Data)->ID + lVar4);
      }
      window = *ppIVar3;
      window->DockNode = (ImGuiDockNode *)0x0;
      window->field_0x43a = window->field_0x43a & 0xfe;
      DockNodeAddWindow(dst_node,window,(bool)(bVar6 ^ 1));
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 0x28;
    } while (lVar5 < (src_node->Windows).Size);
  }
  ppIVar3 = (src_node->Windows).Data;
  if (ppIVar3 != (ImGuiWindow **)0x0) {
    (src_node->Windows).Size = 0;
    (src_node->Windows).Capacity = 0;
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + -1;
    }
    (*GImAllocatorFreeFunc)(ppIVar3,GImAllocatorUserData);
    (src_node->Windows).Data = (ImGuiWindow **)0x0;
  }
  if ((bVar6 == false) && (pIVar2 = src_node->TabBar, pIVar2 != (ImGuiTabBar *)0x0)) {
    if (dst_node->TabBar != (ImGuiTabBar *)0x0) {
      dst_node->TabBar->SelectedTabId = pIVar2->SelectedTabId;
    }
    IM_DELETE<ImGuiTabBar>(pIVar2);
    src_node->TabBar = (ImGuiTabBar *)0x0;
  }
  return;
}

Assistant:

static void ImGui::DockNodeMoveWindows(ImGuiDockNode* dst_node, ImGuiDockNode* src_node)
{
    // Insert tabs in the same orders as currently ordered (node->Windows isn't ordered)
    IM_ASSERT(src_node && dst_node && dst_node != src_node);
    ImGuiTabBar* src_tab_bar = src_node->TabBar;
    if (src_tab_bar != NULL)
        IM_ASSERT(src_node->Windows.Size == src_node->TabBar->Tabs.Size);

    // If the dst_node is empty we can just move the entire tab bar (to preserve selection, scrolling, etc.)
    bool move_tab_bar = (src_tab_bar != NULL) && (dst_node->TabBar == NULL);
    if (move_tab_bar)
    {
        dst_node->TabBar = src_node->TabBar;
        src_node->TabBar = NULL;
    }

    for (int n = 0; n < src_node->Windows.Size; n++)
    {
        ImGuiWindow* window = src_tab_bar ? src_tab_bar->Tabs[n].Window : src_node->Windows[n];
        window->DockNode = NULL;
        window->DockIsActive = false;
        DockNodeAddWindow(dst_node, window, move_tab_bar ? false : true);
    }
    src_node->Windows.clear();

    if (!move_tab_bar && src_node->TabBar)
    {
        if (dst_node->TabBar)
            dst_node->TabBar->SelectedTabId = src_node->TabBar->SelectedTabId;
        DockNodeRemoveTabBar(src_node);
    }
}